

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::VariablesQbIncrementPosition(ChNodeFEAxyzrot *this,double step)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar14 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChVector<double> newspeed;
  ChQuaternion<double> mnewrot;
  ChVector<double> newwel;
  ChVector<double> local_a0;
  ChQuaternion<double> local_88;
  undefined8 local_68;
  double local_58;
  ChVector<double> local_50;
  ChVector<double> local_38;
  undefined1 extraout_var [56];
  
  ChVariables::Get_qb((ChVectorRef *)&local_50,(ChVariables *)&this->variables);
  local_88.m_data[0] = local_50.m_data[0];
  local_88.m_data[1] = 1.48219693752374e-323;
  local_68 = 0;
  local_58 = local_50.m_data[1];
  local_88.m_data[3] = (double)&local_50;
  if (2 < (long)local_50.m_data[1]) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_a0,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_88,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)&local_38,(ChVariables *)&this->variables);
    local_88.m_data[0] = (double)((long)local_38.m_data[0] + 0x18);
    local_88.m_data[1] = 1.48219693752374e-323;
    local_68 = 3;
    local_58 = local_38.m_data[1];
    local_88.m_data[3] = (double)&local_38;
    if (5 < (long)local_38.m_data[1]) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_50,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_88,(type *)0x0);
      dVar1 = *(double *)&this->field_0x30;
      dVar2 = *(double *)&this->field_0x28;
      *(double *)&(this->super_ChNodeFEAbase).field_0x20 =
           step * local_a0.m_data[0] + *(double *)&(this->super_ChNodeFEAbase).field_0x20;
      *(double *)&this->field_0x28 = step * local_a0.m_data[1] + dVar2;
      *(double *)&this->field_0x30 = step * local_a0.m_data[2] + dVar1;
      dVar1 = *(double *)&this->field_0x38;
      dVar2 = *(double *)&this->field_0x40;
      uVar3 = *(ulong *)&this->field_0x48;
      uVar4 = *(ulong *)&this->field_0x50;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_50.m_data[0];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)&this->field_0x58;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_50.m_data[1] * *(double *)&this->field_0x60;
      auVar5 = vfmadd231sd_fma(auVar24,auVar14,auVar5);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_50.m_data[2];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)&this->field_0x68;
      auVar5 = vfmadd231sd_fma(auVar5,auVar19,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)&this->field_0x70;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_50.m_data[1] * *(double *)&this->field_0x78;
      auVar6 = vfmadd231sd_fma(auVar29,auVar14,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)&this->field_0x80;
      auVar6 = vfmadd231sd_fma(auVar6,auVar19,auVar8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)&this->field_0x88;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_50.m_data[1] * *(double *)&this->field_0x90;
      auVar7 = vfmadd231sd_fma(auVar17,auVar14,auVar15);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)&this->field_0x98;
      auVar7 = vfmadd231sd_fma(auVar7,auVar19,auVar9);
      dVar28 = auVar6._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar28 * dVar28;
      auVar6 = vfmadd231sd_fma(auVar20,auVar5,auVar5);
      auVar21 = vfmadd231sd_fma(auVar6,auVar7,auVar7);
      if (auVar21._0_8_ < 0.0) {
        dVar11 = sqrt(auVar21._0_8_);
        auVar21._8_8_ = 0;
      }
      else {
        auVar6 = vsqrtsd_avx(auVar21,auVar21);
        dVar11 = auVar6._0_8_;
      }
      if (auVar21._0_8_ < 0.0) {
        dVar12 = sqrt(auVar21._0_8_);
      }
      else {
        auVar6 = vsqrtsd_avx(auVar21,auVar21);
        dVar12 = auVar6._0_8_;
      }
      bVar10 = 2.2250738585072014e-308 <= dVar12;
      dVar12 = 1.0 / dVar12;
      dVar11 = dVar11 * step * 0.5;
      dVar13 = sin(dVar11);
      auVar16._0_8_ = cos(dVar11);
      auVar16._8_56_ = extraout_var;
      dVar11 = dVar13 * (double)((ulong)bVar10 * (long)(dVar12 * auVar5._0_8_) +
                                (ulong)!bVar10 * 0x3ff0000000000000);
      dVar28 = dVar13 * (double)((ulong)bVar10 * (long)(dVar12 * dVar28));
      dVar13 = dVar13 * (double)((ulong)bVar10 * (long)(dVar12 * auVar7._0_8_));
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar2;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar1;
      auVar15 = auVar16._0_16_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar2 * dVar11;
      auVar5 = vfmsub231sd_fma(auVar30,auVar15,auVar35);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar3;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar28;
      auVar5 = vfnmadd231sd_fma(auVar5,auVar22,auVar33);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar4;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar13;
      auVar7 = vfnmadd231sd_fma(auVar5,auVar25,auVar36);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar1 * dVar11;
      auVar5 = vfmadd231sd_fma(auVar31,auVar15,auVar34);
      auVar5 = vfnmadd231sd_fma(auVar5,auVar25,auVar33);
      auVar5 = vfmadd231sd_fma(auVar5,auVar22,auVar36);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar1 * dVar28;
      auVar6 = vfmadd231sd_fma(auVar32,auVar15,auVar33);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar13;
      auVar6 = vfmadd231sd_fma(auVar6,auVar26,auVar34);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar11;
      auVar8 = vfnmadd231sd_fma(auVar6,auVar18,auVar36);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar1 * dVar13;
      auVar6 = vfmadd231sd_fma(auVar27,auVar15,auVar36);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar28;
      auVar6 = vfnmadd231sd_fma(auVar6,auVar23,auVar34);
      auVar6 = vfmadd231sd_fma(auVar6,auVar18,auVar33);
      local_88.m_data[0] = auVar7._0_8_;
      local_88.m_data[1] = auVar5._0_8_;
      local_88.m_data[2] = auVar8._0_8_;
      local_88.m_data[3] = auVar6._0_8_;
      ChFrame<double>::SetRot((ChFrame<double> *)&(this->super_ChNodeFEAbase).field_0x18,&local_88);
      return;
    }
  }
  local_88.m_data[1] = 1.48219693752374e-323;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbIncrementPosition(double step) {
    // if (!this->IsActive())
    //	return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = this->Amatrix * newwel;
    double mangle = newwel_abs.Length() * step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}